

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O1

void Am_Visible_Animator_Abort_Do_proc(Am_Object *interp)

{
  Am_Object_Method_Type *pAVar1;
  Am_Value *in_value;
  Am_Object sub_animator;
  Am_Object AStack_28;
  Am_Object local_20;
  Am_Object local_18;
  
  in_value = Am_Object::Get(interp,0x108,0);
  Am_Object::Am_Object(&local_18,in_value);
  Am_Object::Am_Object(&local_20,&local_18);
  Am_Abort_Animator(&local_20);
  Am_Object::~Am_Object(&local_20);
  pAVar1 = Am_Visible_Animator_Do.Call;
  Am_Object::Am_Object(&AStack_28,interp);
  (*pAVar1)((Am_Object_Data *)&AStack_28);
  Am_Object::~Am_Object(&AStack_28);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Visible_Animator_Abort_Do,
                 (Am_Object interp))
{
  Am_INTER_TRACE_PRINT(interp, "Visible Abort of " << interp);

  Am_Object sub_animator = interp.Get(Am_SUB_ANIMATOR);
  Am_Abort_Animator(sub_animator);
  Am_Visible_Animator_Do.Call(interp);
}